

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O3

Vec_Int_t * Mop_ManCollectStats(Mop_Man_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Vec_Wrd_t *pVVar6;
  word *pwVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  int local_5c;
  
  iVar1 = p->nWordsIn;
  uVar13 = iVar1 * 0x20;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = uVar13;
  if (iVar1 == 0) {
    piVar9 = (int *)0x0;
  }
  else {
    piVar9 = (int *)calloc(1,(long)(int)uVar13 * 4);
  }
  pVVar8->pArray = piVar9;
  pVVar8->nSize = uVar13;
  pVVar4 = p->vCubes;
  local_5c = pVVar4->nSize;
  if (0 < local_5c) {
    piVar5 = pVVar4->pArray;
    pVVar6 = p->vWordsIn;
    uVar15 = 1;
    if (1 < (int)uVar13) {
      uVar15 = (ulong)uVar13;
    }
    iVar2 = p->nWordsIn;
    lVar17 = 0;
    do {
      uVar16 = iVar2 * piVar5[lVar17];
      if (((int)uVar16 < 0) || (pVVar6->nSize <= (int)uVar16)) {
LAB_00334949:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      uVar3 = p->nWordsOut;
      uVar10 = piVar5[lVar17] * uVar3;
      if (((int)uVar10 < 0) || (p->vWordsOut->nSize <= (int)uVar10)) goto LAB_00334949;
      if ((int)uVar3 < 1) {
        iVar11 = 0;
      }
      else {
        uVar18 = 0;
        iVar11 = 0;
        do {
          uVar12 = p->vWordsOut->pArray[uVar10 + uVar18];
          uVar12 = uVar12 - (uVar12 >> 1 & 0x5555555555555555);
          uVar12 = (uVar12 >> 2 & 0x3333333333333333) + (uVar12 & 0x3333333333333333);
          uVar12 = (uVar12 >> 4) + uVar12 & 0xf0f0f0f0f0f0f0f;
          uVar12 = (uVar12 >> 8) + uVar12;
          lVar14 = (uVar12 >> 0x10) + uVar12;
          iVar11 = iVar11 + ((int)((ulong)lVar14 >> 0x20) + (int)lVar14 & 0xffU);
          uVar18 = uVar18 + 1;
        } while (uVar3 != uVar18);
      }
      if (0 < iVar1) {
        pwVar7 = pVVar6->pArray;
        uVar18 = 0;
        do {
          if ((pwVar7[(ulong)uVar16 + (uVar18 >> 5 & 0x7ffffff)] >> ((char)uVar18 * '\x02' & 0x3fU)
              & 3) != 0) {
            if ((long)(int)uVar13 <= (long)uVar18) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
            }
            piVar9[uVar18] = piVar9[uVar18] + iVar11;
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 != uVar15);
        local_5c = pVVar4->nSize;
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < local_5c);
  }
  return pVVar8;
}

Assistant:

Vec_Int_t * Mop_ManCollectStats( Mop_Man_t * p )
{
    int i, v, iCube, nVars = 32 * p->nWordsIn;
    Vec_Int_t * vStats = Vec_IntStart( nVars );
    Vec_IntForEachEntry( p->vCubes, iCube, i )
    {
        word * pCube = Mop_ManCubeIn(p, iCube);
        int nOutLits = Mop_ManCountOnes( Mop_ManCubeOut(p, iCube), p->nWordsOut );
        for ( v = 0; v < nVars; v++ )
            if ( Abc_TtGetQua(pCube, v) )
                Vec_IntAddToEntry( vStats, v, nOutLits );
    }
    return vStats;
}